

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O2

int LS_GlassBreak(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  bool *pbVar1;
  FState *pFVar2;
  double dVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  AActor *this;
  DWORD *pDVar8;
  long lVar9;
  int iVar10;
  bool quest2;
  bool quest1;
  undefined1 local_78 [16];
  AActor *local_68;
  FName local_5c;
  DVector3 local_58;
  double local_40;
  double local_38;
  
  ln->flags = ln->flags & 0xffff7ffe;
  bVar4 = P_ChangeSwitchTexture(ln->sidedef[0],0,'\0',&quest1);
  ln->special = 0;
  if (ln->sidedef[1] == (side_t *)0x0) {
    quest2 = quest1;
    if (!bVar4) {
      return 0;
    }
  }
  else {
    bVar5 = P_ChangeSwitchTexture(ln->sidedef[1],0,'\0',&quest2);
    if (!bVar4 && !bVar5) {
      return 0;
    }
  }
  if (arg0 == 0) {
    local_78._0_8_ = ((ln->v2->p).X + (ln->v1->p).X) * 0.5;
    local_78._8_8_ = ((ln->v2->p).Y + (ln->v1->p).Y) * 0.5;
    local_40 = (ln->delta).Y;
    local_38 = -(ln->delta).X;
    local_68 = it;
    TVector2<double>::Unit((TVector2<double> *)&local_58);
    dVar3 = local_58.Y + local_58.Y + (double)local_78._8_8_;
    local_78._8_4_ = SUB84(dVar3,0);
    local_78._0_8_ = local_58.X + local_58.X + (double)local_78._0_8_;
    local_78._12_4_ = (int)((ulong)dVar3 >> 0x20);
    iVar10 = 7;
    while (bVar4 = iVar10 != 0, iVar10 = iVar10 + -1, it = local_68, bVar4) {
      FName::FName(&local_5c,"GlassJunk");
      local_58.X = (double)local_78._0_8_;
      local_58.Y = (double)local_78._8_8_;
      local_58.Z = -2147483648.0;
      this = Spawn(&local_5c,&local_58,ALLOW_REPLACE);
      (this->__Pos).Z = (this->__Pos).Z + 24.0;
      pFVar2 = this->SpawnState;
      iVar6 = FRandom::operator()(&pr_glass);
      AActor::SetState(this,pFVar2 + iVar6 % this->health,false);
      iVar6 = FRandom::operator()(&pr_glass);
      (this->Angles).Yaw.Degrees = (double)iVar6 * 1.40625;
      uVar7 = FRandom::operator()(&pr_glass);
      AActor::VelFromAngle(this,(double)(uVar7 & 3));
      uVar7 = FRandom::operator()(&pr_glass);
      (this->Vel).Z = (double)(uVar7 & 7);
      iVar6 = FRandom::operator()(&pr_glass);
      this->tics = this->tics + iVar6;
    }
  }
  if ((quest1 != false) || (quest2 == true)) {
    if (it == (AActor *)0x0) {
      pDVar8 = &pr_dmspawn.NameCRC;
      lVar9 = 0;
      do {
        if (lVar9 == 8) {
          return 0;
        }
        pDVar8 = pDVar8 + 0xa8;
        pbVar1 = playeringame + lVar9;
        lVar9 = lVar9 + 1;
      } while (*pbVar1 != true);
      it = *(AActor **)pDVar8;
      if (it == (AActor *)0x0) {
        return 0;
      }
    }
    AActor::GiveInventoryType(it,QuestItemClasses[0x1c]);
    AActor::GiveInventoryType(it,(PClassActor *)AUpgradeAccuracy::RegistrationInfo.MyClass);
    AActor::GiveInventoryType(it,(PClassActor *)AUpgradeStamina::RegistrationInfo.MyClass);
  }
  return 0;
}

Assistant:

FUNC(LS_GlassBreak)
// GlassBreak (bNoJunk)
{
	bool switched;
	bool quest1, quest2;

	ln->flags &= ~(ML_BLOCKING|ML_BLOCKEVERYTHING);
	switched = P_ChangeSwitchTexture (ln->sidedef[0], false, 0, &quest1);
	ln->special = 0;
	if (ln->sidedef[1] != NULL)
	{
		switched |= P_ChangeSwitchTexture (ln->sidedef[1], false, 0, &quest2);
	}
	else
	{
		quest2 = quest1;
	}
	if (switched)
	{
		if (!arg0)
		{ // Break some glass
			AActor *glass;

			DVector2 linemid((ln->v1->fX() + ln->v2->fX()) / 2, (ln->v1->fY() + ln->v2->fY()) / 2);

			// remove dependence on sector size and always spawn 2 map units in front of the line.
			DVector2 normal(ln->Delta().Y, -ln->Delta().X);
			linemid += normal.Unit() * 2;
			/* old code:
			x += (ln->frontsector->centerspot.x - x) / 5;
			y += (ln->frontsector->centerspot.y - y) / 5;
			*/

			for (int i = 0; i < 7; ++i)
			{
				glass = Spawn("GlassJunk", DVector3(linemid, ONFLOORZ), ALLOW_REPLACE);

				glass->AddZ(24.);
				glass->SetState (glass->SpawnState + (pr_glass() % glass->health));

				glass->Angles.Yaw = pr_glass() * (360 / 256.);
				glass->VelFromAngle(pr_glass() & 3);
				glass->Vel.Z = (pr_glass() & 7);
				// [RH] Let the shards stick around longer than they did in Strife.
				glass->tics += pr_glass();
			}
		}
		if (quest1 || quest2)
		{ // Up stats and signal this mission is complete
			if (it == NULL)
			{
				for (int i = 0; i < MAXPLAYERS; ++i)
				{
					if (playeringame[i])
					{
						it = players[i].mo;
						break;
					}
				}
			}
			if (it != NULL)
			{
				it->GiveInventoryType (QuestItemClasses[28]);
				it->GiveInventoryType (RUNTIME_CLASS(AUpgradeAccuracy));
				it->GiveInventoryType (RUNTIME_CLASS(AUpgradeStamina));
			}
		}
	}
	// We already changed the switch texture, so don't make the main code switch it back.
	return false;
}